

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

Value * __thiscall
duckdb::UpdateInfo::GetValue(Value *__return_storage_ptr__,UpdateInfo *this,idx_t index)

{
  long lVar1;
  LogicalTypeId LVar2;
  NotImplementedException *this_00;
  string local_40;
  
  lVar1 = (ulong)this->max * 4;
  LVar2 = (this->segment->column_data->type).id_;
  if (LVar2 == INTEGER) {
    Value::INTEGER(__return_storage_ptr__,*(int32_t *)((long)&this[1].segment + index * 4 + lVar1));
  }
  else {
    if (LVar2 != VALIDITY) {
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Unimplemented type for UpdateInfo::GetValue","");
      NotImplementedException::NotImplementedException(this_00,&local_40);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    Value::BOOLEAN(__return_storage_ptr__,*(bool *)((long)&this[1].segment + index + lVar1));
  }
  return __return_storage_ptr__;
}

Assistant:

Value UpdateInfo::GetValue(idx_t index) {
	auto &type = segment->column_data.type;

	auto tuple_data = GetValues();
	switch (type.id()) {
	case LogicalTypeId::VALIDITY:
		return Value::BOOLEAN(reinterpret_cast<bool *>(tuple_data)[index]);
	case LogicalTypeId::INTEGER:
		return Value::INTEGER(reinterpret_cast<int32_t *>(tuple_data)[index]);
	default:
		throw NotImplementedException("Unimplemented type for UpdateInfo::GetValue");
	}
}